

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  char local_21;
  ColourGuard local_20;
  
  uVar1 = *(undefined4 *)((long)&(_testInfo->name).m_start + 4);
  sVar3 = (_testInfo->name).m_size;
  uVar2 = *(undefined4 *)((long)&(_testInfo->name).m_size + 4);
  *(undefined4 *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       *(undefined4 *)&(_testInfo->name).m_start;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start + 4) =
       uVar1;
  *(int *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = (int)sVar3;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size + 4) =
       uVar2;
  iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar4) != ((long *)CONCAT44(extraout_var,iVar4))[1]) {
    local_20.m_colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (local_20.m_colourImpl == (ColourImpl *)0x0) {
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x385,
                    "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
                   );
    }
    poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_20.m_code = BrightYellow;
    local_20.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_20,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Filters: ",9);
    iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar4),poVar5);
    local_21 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_21,1);
    if (local_20.m_engaged == true) {
      (*(local_20.m_colourImpl)->_vptr_ColourImpl[2])(local_20.m_colourImpl,0);
    }
  }
  poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Randomness seeded to: ",0x16);
  getSeed();
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_20.m_colourImpl = (ColourImpl *)CONCAT71(local_20.m_colourImpl._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_20,1);
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testInfo) {
    StreamingReporterBase::testRunStarting(_testInfo);
    if ( m_config->testSpec().hasFilters() ) {
        m_stream << m_colour->guardColour( Colour::BrightYellow ) << "Filters: "
                 << m_config->testSpec() << '\n';
    }
    m_stream << "Randomness seeded to: " << getSeed() << '\n';
}